

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3Fts5ParseSetColset(Fts5Parse *pParse,Fts5ExprNode *pExpr,Fts5Colset *pColset)

{
  long in_FS_OFFSET;
  Fts5Colset *pFree;
  Fts5Colset *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = pColset;
  if (pParse->pConfig->eDetail == 1) {
    sqlite3Fts5ParseError(pParse,"fts5: column queries are not supported (detail=none)");
  }
  else {
    fts5ParseSetColset(pParse,pExpr,pColset,&local_20);
    pColset = local_20;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    sqlite3_free(pColset);
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void sqlite3Fts5ParseSetColset(
  Fts5Parse *pParse,
  Fts5ExprNode *pExpr,
  Fts5Colset *pColset
){
  Fts5Colset *pFree = pColset;
  if( pParse->pConfig->eDetail==FTS5_DETAIL_NONE ){
    sqlite3Fts5ParseError(pParse,
        "fts5: column queries are not supported (detail=none)"
    );
  }else{
    fts5ParseSetColset(pParse, pExpr, pColset, &pFree);
  }
  sqlite3_free(pFree);
}